

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_platform_sdl2.c
# Opt level: O0

void FAudio_UTF8_To_UTF16(char *src,uint16_t *dst,size_t len)

{
  long in_RDX;
  short *in_RSI;
  uint32_t cp;
  uint local_1c;
  ulong local_18;
  short *local_10;
  char *local_8;
  
  local_18 = in_RDX - 2;
  local_10 = in_RSI;
  while ((1 < local_18 && (local_1c = FAudio_UTF8_CodePoint(&local_8), local_1c != 0))) {
    if (local_1c == 0xffffffff) {
      local_1c = 0x3f;
    }
    if (0xffff < local_1c) {
      if (local_18 < 4) break;
      *local_10 = ((ushort)(local_1c - 0x10000 >> 10) & 0x3ff) + 0xd800;
      local_18 = local_18 - 2;
      local_1c = (local_1c - 0x10000 & 0x3ff) + 0xdc00;
      local_10 = local_10 + 1;
    }
    *local_10 = (short)local_1c;
    local_18 = local_18 - 2;
    local_10 = local_10 + 1;
  }
  *local_10 = 0;
  return;
}

Assistant:

void FAudio_UTF8_To_UTF16(const char *src, uint16_t *dst, size_t len)
{
    len -= sizeof (uint16_t);   /* save room for null char. */
    while (len >= sizeof (uint16_t))
    {
        uint32_t cp = FAudio_UTF8_CodePoint(&src);
        if (cp == 0)
            break;
        else if (cp == UNICODE_BOGUS_CHAR_VALUE)
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;

        if (cp > 0xFFFF)  /* encode as surrogate pair */
        {
            if (len < (sizeof (uint16_t) * 2))
                break;  /* not enough room for the pair, stop now. */

            cp -= 0x10000;  /* Make this a 20-bit value */

            *(dst++) = 0xD800 + ((cp >> 10) & 0x3FF);
            len -= sizeof (uint16_t);

            cp = 0xDC00 + (cp & 0x3FF);
        } /* if */

        *(dst++) = cp;
        len -= sizeof (uint16_t);
    } /* while */

    *dst = 0;
}